

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void u_to_u8_test(int line,UTF_US16 *str1,UTF_S8 *str2,bool ok)

{
  bool bVar1;
  UTF_RET UVar2;
  int iVar3;
  UTF_US8 tmp;
  UTF_UC8 buf [256];
  UTF_US8 local_148;
  UTF_UC8 local_128 [264];
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  bVar1 = UTF_u_to_u8<(char)63>(str1,&local_148);
  UTF_test(line,bVar1 == ok);
  bVar1 = std::operator==(&local_148,
                          (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)str2);
  UTF_test(line,bVar1);
  UVar2 = UTF_uj16_to_uj8((str1->_M_dataplus)._M_p,str1->_M_string_length,local_128,0x100);
  UTF_test(line,UVar2 == UTF_SUCCESS);
  iVar3 = UTF_uj8_cmpn(local_148._M_dataplus._M_p,local_128,local_148._M_string_length + 1);
  UTF_test(line,iVar3 == 0);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&local_148);
  return;
}

Assistant:

void u_to_u8_test(int line, const UTF_US16& str1, const UTF_S8& str2, bool ok)
{
    UTF_US8 tmp;
    UTF_UC8 buf[256];
    UTF_test(line, UTF_u_to_u8<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == reinterpret_cast<const UTF_US8&>(str2));
    UTF_test(line, UTF_uj16_to_uj8(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj8_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}